

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::evaluateBatch(TasmanianSparseGrid *this,double *x,int num_x,double *y)

{
  BaseCanonicalGrid *pBVar1;
  double *pdVar2;
  Data2D<double> x_tmp;
  Data2D<double> local_48;
  
  local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.stride = 0;
  local_48.num_strips = 0;
  local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  pdVar2 = formCanonicalPoints<double>(this,x,&local_48,num_x);
  (*pBVar1->_vptr_BaseCanonicalGrid[0x13])(pBVar1,pdVar2,(ulong)(uint)num_x,y);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_48.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TasmanianSparseGrid::evaluateBatch(const double x[], int num_x, double y[]) const{
    Data2D<double> x_tmp;
    base->evaluateBatch(formCanonicalPoints(x, x_tmp, num_x), num_x, y);
}